

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O0

TestPackageRegistry * tcu::TestPackageRegistry::getOrDestroy(bool isCreate)

{
  TestPackageRegistry *pTVar1;
  TestPackageRegistry *pTStack_10;
  bool isCreate_local;
  
  pTVar1 = getOrDestroy::s_ptr;
  if (isCreate) {
    if (getOrDestroy::s_ptr == (TestPackageRegistry *)0x0) {
      pTVar1 = (TestPackageRegistry *)operator_new(0x18);
      TestPackageRegistry(pTVar1);
      getOrDestroy::s_ptr = pTVar1;
    }
    pTStack_10 = getOrDestroy::s_ptr;
  }
  else {
    if (getOrDestroy::s_ptr != (TestPackageRegistry *)0x0) {
      if (getOrDestroy::s_ptr != (TestPackageRegistry *)0x0) {
        ~TestPackageRegistry(getOrDestroy::s_ptr);
        operator_delete(pTVar1,0x18);
      }
      getOrDestroy::s_ptr = (TestPackageRegistry *)0x0;
    }
    pTStack_10 = (TestPackageRegistry *)0x0;
  }
  return pTStack_10;
}

Assistant:

TestPackageRegistry* TestPackageRegistry::getOrDestroy (bool isCreate)
{
	static TestPackageRegistry* s_ptr = DE_NULL;

	if (isCreate)
	{
		if (!s_ptr)
			s_ptr = new TestPackageRegistry();

		return s_ptr;
	}
	else
	{
		if (s_ptr)
		{
			delete s_ptr;
			s_ptr = DE_NULL;
		}

		return DE_NULL;
	}
}